

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skolem.cpp
# Opt level: O3

uint Shell::Skolem::addSkolemFunction
               (uint arity,uint taArity,TermList *domainSorts,TermList rangeSort,char *suffix)

{
  undefined1 *puVar1;
  Symbol *this;
  uint uVar2;
  OperatorKey *key;
  OperatorType *type;
  
  uVar2 = Kernel::Signature::addSkolemFunction(DAT_00b521b0,arity,suffix,false);
  this = (DAT_00b521b0->_funs)._stack[uVar2];
  puVar1 = &this->field_0x40;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x40000;
  key = Kernel::OperatorType::setupKey(arity - taArity,domainSorts);
  *(uint64_t *)(key + (ulong)(arity - taArity) * 8 + 8) = rangeSort._content;
  type = Kernel::OperatorType::getTypeFromKey(key,taArity);
  Kernel::Signature::Symbol::setType(this,type);
  return uVar2;
}

Assistant:

unsigned Skolem::addSkolemFunction(unsigned arity, unsigned taArity, TermList* domainSorts,
    TermList rangeSort, const char* suffix)
{
  //ASS(arity==0 || domainSorts!=0);

  unsigned fun = env.signature->addSkolemFunction(arity, suffix);
  Signature::Symbol* fnSym = env.signature->getFunction(fun);
  fnSym->markSkipCongruence();
  OperatorType* ot = OperatorType::getFunctionType(arity - taArity, domainSorts, rangeSort, taArity);
  fnSym->setType(ot);
  return fun;
}